

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void checksum_final(chksumwork_conflict *sumwrk,chksumval_conflict *sumval)

{
  sumalg sVar1;
  chksumval_conflict *sumval_local;
  chksumwork_conflict *sumwrk_local;
  
  sVar1 = sumwrk->alg;
  if (sVar1 == CKSUM_NONE) {
    sumval->len = 0;
  }
  else if (sVar1 == CKSUM_SHA1) {
    __archive_sha1final(&sumwrk->sha1ctx,sumval->val);
    sumval->len = 0x14;
  }
  else if (sVar1 == CKSUM_MD5) {
    __archive_md5final(&sumwrk->md5ctx,sumval->val);
    sumval->len = 0x10;
  }
  sumval->alg = sumwrk->alg;
  return;
}

Assistant:

static int
_checksum_final(struct chksumwork *sumwrk, const void *val, size_t len)
{
	unsigned char sum[MAX_SUM_SIZE];
	int r = ARCHIVE_OK;

	switch (sumwrk->alg) {
	case CKSUM_NONE:
		break;
	case CKSUM_SHA1:
		archive_sha1_final(&(sumwrk->sha1ctx), sum);
		if (len != SHA1_SIZE ||
		    memcmp(val, sum, SHA1_SIZE) != 0)
			r = ARCHIVE_FAILED;
		break;
	case CKSUM_MD5:
		archive_md5_final(&(sumwrk->md5ctx), sum);
		if (len != MD5_SIZE ||
		    memcmp(val, sum, MD5_SIZE) != 0)
			r = ARCHIVE_FAILED;
		break;
	}
	return (r);
}